

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O0

void __thiscall
tcu::TestLog::writeImage
          (TestLog *this,char *name,char *description,ConstPixelBufferAccess *access,
          Vec4 *pixelScale,Vec4 *pixelBias,qpImageCompressionMode compressionMode)

{
  Vector<int,_2> *this_00;
  void **this_01;
  allocator<float> *this_02;
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  qpImageFormat format_00;
  int iVar6;
  TextureFormat *pTVar7;
  TextureFormat *this_03;
  float *pfVar8;
  void *pvVar9;
  int *piVar10;
  ostream *poVar11;
  char *pcVar12;
  reference data;
  string local_668 [36];
  undefined1 local_644 [16];
  Vector<float,_4> local_634;
  undefined1 local_624 [8];
  Vec4 s_2;
  int py_1;
  int px_1;
  int x_2;
  int y_2;
  int z_1;
  Vector<float,_4> local_5f0;
  undefined1 local_5e0 [8];
  Vec4 b;
  Vec4 s_1;
  Vec4 p;
  float zf;
  float yf_1;
  float xf_1;
  int py;
  int px;
  int x_1;
  int y_1;
  int z;
  ostringstream longDesc_1;
  Vector<float,_4> local_414;
  undefined1 local_404 [8];
  Sampler sampler_1;
  PixelBufferAccess logImageAccess_1;
  undefined1 local_398 [8];
  TextureLevel logImage_1;
  undefined1 local_368 [8];
  PixelBufferAccess blendImageAccess;
  undefined1 local_338 [8];
  vector<float,_std::allocator<float>_> blendImage;
  int logImageH;
  int logImageW;
  int d;
  int h;
  int w;
  tcu local_300 [8];
  IVec3 scaledSize;
  float blendFactor;
  undefined1 local_2d0 [16];
  Vector<float,_4> local_2c0;
  undefined1 local_2b0 [8];
  Vec4 s;
  float xf;
  float yf;
  int x;
  int y;
  ostringstream longDesc;
  undefined1 local_108 [8];
  PixelBufferAccess logImageAccess;
  undefined1 local_d8 [8];
  TextureLevel logImage;
  tcu local_a4 [8];
  IVec2 logImageSize;
  undefined1 local_8c [8];
  Sampler sampler;
  bool isRGBA;
  int depth;
  int height;
  int width;
  TextureFormat *format;
  Vec4 *pixelBias_local;
  Vec4 *pixelScale_local;
  ConstPixelBufferAccess *access_local;
  char *description_local;
  char *name_local;
  TestLog *this_local;
  
  pTVar7 = ConstPixelBufferAccess::getFormat(access);
  iVar1 = ConstPixelBufferAccess::getWidth(access);
  iVar2 = ConstPixelBufferAccess::getHeight(access);
  sampler.depthStencilMode = ConstPixelBufferAccess::getDepth(access);
  dVar3 = qpTestLog_getLogFlags(this->m_log);
  if ((dVar3 & 1) == 0) {
    if ((((sampler.depthStencilMode == MODE_STENCIL) && (pTVar7->type == UNORM_INT8)) &&
        (iVar1 < 0x1001)) &&
       ((iVar2 < 0x1001 && ((pTVar7->order == RGB || (pTVar7->order == RGBA)))))) {
      iVar4 = ConstPixelBufferAccess::getPixelPitch(access);
      this_03 = ConstPixelBufferAccess::getFormat(access);
      iVar5 = TextureFormat::getPixelSize(this_03);
      if (iVar4 == iVar5) {
        pfVar8 = Vector<float,_4>::operator[](pixelBias,0);
        if ((*pfVar8 == 0.0) && (!NAN(*pfVar8))) {
          pfVar8 = Vector<float,_4>::operator[](pixelBias,1);
          if ((*pfVar8 == 0.0) && (!NAN(*pfVar8))) {
            pfVar8 = Vector<float,_4>::operator[](pixelBias,2);
            if ((*pfVar8 == 0.0) && (!NAN(*pfVar8))) {
              pfVar8 = Vector<float,_4>::operator[](pixelBias,3);
              if ((*pfVar8 == 0.0) && (!NAN(*pfVar8))) {
                pfVar8 = Vector<float,_4>::operator[](pixelScale,0);
                if ((*pfVar8 == 1.0) && (!NAN(*pfVar8))) {
                  pfVar8 = Vector<float,_4>::operator[](pixelScale,1);
                  if ((*pfVar8 == 1.0) && (!NAN(*pfVar8))) {
                    pfVar8 = Vector<float,_4>::operator[](pixelScale,2);
                    if ((*pfVar8 == 1.0) && (!NAN(*pfVar8))) {
                      pfVar8 = Vector<float,_4>::operator[](pixelScale,3);
                      if ((*pfVar8 == 1.0) && (!NAN(*pfVar8))) {
                        sampler._55_1_ = pTVar7->order == RGBA;
                        format_00 = (qpImageFormat)(byte)sampler._55_1_;
                        iVar4 = ConstPixelBufferAccess::getRowPitch(access);
                        pvVar9 = ConstPixelBufferAccess::getDataPtr(access);
                        writeImage(this,name,description,compressionMode,format_00,iVar1,iVar2,iVar4
                                   ,pvVar9);
                        return;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (sampler.depthStencilMode == MODE_STENCIL) {
      Vector<float,_4>::Vector((Vector<float,_4> *)&logImageSize,0.0,0.0,0.0,0.0);
      Sampler::Sampler((Sampler *)local_8c,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,LINEAR,NEAREST,
                       0.0,true,COMPAREMODE_NONE,0,(Vector<float,_4> *)&logImageSize,false,
                       MODE_DEPTH);
      this_00 = (Vector<int,_2> *)((long)&logImage.m_data.m_cap + 4);
      Vector<int,_2>::Vector(this_00,iVar1,iVar2);
      computeScaledSize<2>(local_a4,this_00,0x1000);
      this_01 = &logImageAccess.super_ConstPixelBufferAccess.m_data;
      TextureFormat::TextureFormat((TextureFormat *)this_01,RGBA,UNORM_INT8);
      piVar10 = Vector<int,_2>::x((Vector<int,_2> *)local_a4);
      iVar1 = *piVar10;
      piVar10 = Vector<int,_2>::y((Vector<int,_2> *)local_a4);
      TextureLevel::TextureLevel((TextureLevel *)local_d8,(TextureFormat *)this_01,iVar1,*piVar10,1)
      ;
      TextureLevel::getAccess((PixelBufferAccess *)local_108,(TextureLevel *)local_d8);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&x);
      poVar11 = std::operator<<((ostream *)&x,description);
      poVar11 = std::operator<<(poVar11," (p\' = p * ");
      poVar11 = tcu::operator<<(poVar11,pixelScale);
      poVar11 = std::operator<<(poVar11," + ");
      poVar11 = tcu::operator<<(poVar11,pixelBias);
      std::operator<<(poVar11,")");
      for (yf = 0.0; iVar1 = TextureLevel::getHeight((TextureLevel *)local_d8), (int)yf < iVar1;
          yf = (float)((int)yf + 1)) {
        for (xf = 0.0; iVar1 = TextureLevel::getWidth((TextureLevel *)local_d8), (int)xf < iVar1;
            xf = (float)((int)xf + 1)) {
          iVar1 = TextureLevel::getHeight((TextureLevel *)local_d8);
          s.m_data[3] = ((float)(int)yf + 0.5) / (float)iVar1;
          iVar1 = TextureLevel::getWidth((TextureLevel *)local_d8);
          s.m_data[2] = ((float)(int)xf + 0.5) / (float)iVar1;
          ConstPixelBufferAccess::sample2D
                    ((ConstPixelBufferAccess *)local_2d0,(Sampler *)access,(FilterMode)local_8c,
                     s.m_data[2],s.m_data[3],sampler.wrapT);
          tcu::operator*((tcu *)&local_2c0,(Vector<float,_4> *)local_2d0,pixelScale);
          tcu::operator+((tcu *)local_2b0,&local_2c0,pixelBias);
          PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_108,(Vec4 *)local_2b0,(int)xf,(int)yf,0);
        }
      }
      std::__cxx11::ostringstream::str();
      pcVar12 = (char *)std::__cxx11::string::c_str();
      iVar1 = ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_108);
      iVar2 = ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)local_108);
      iVar4 = ConstPixelBufferAccess::getRowPitch((ConstPixelBufferAccess *)local_108);
      pvVar9 = PixelBufferAccess::getDataPtr((PixelBufferAccess *)local_108);
      writeImage(this,name,pcVar12,compressionMode,QP_IMAGE_FORMAT_RGBA8888,iVar1,iVar2,iVar4,pvVar9
                );
      std::__cxx11::string::~string((string *)(scaledSize.m_data + 2));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&x);
      TextureLevel::~TextureLevel((TextureLevel *)local_d8);
    }
    else {
      scaledSize.m_data[1] = 0x3f59999a;
      Vector<int,_3>::Vector((Vector<int,_3> *)&h,iVar1,iVar2,sampler.depthStencilMode);
      computeScaledSize<3>(local_300,(Vector<int,_3> *)&h,0x80);
      piVar10 = Vector<int,_3>::x((Vector<int,_3> *)local_300);
      iVar1 = *piVar10;
      piVar10 = Vector<int,_3>::y((Vector<int,_3> *)local_300);
      iVar2 = *piVar10;
      piVar10 = Vector<int,_3>::z((Vector<int,_3> *)local_300);
      iVar4 = *piVar10;
      blendImage.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = iVar1 + -1 + iVar4;
      blendImage.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = iVar1 + iVar4 + iVar2;
      iVar5 = blendImage.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ *
              (int)blendImage.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      blendImageAccess.super_ConstPixelBufferAccess.m_data._4_4_ = 0;
      this_02 = (allocator<float> *)
                ((long)&blendImageAccess.super_ConstPixelBufferAccess.m_data + 3);
      std::allocator<float>::allocator(this_02);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_338,(long)(iVar5 * 4),
                 (value_type_conflict3 *)
                 ((long)&blendImageAccess.super_ConstPixelBufferAccess.m_data + 4),this_02);
      std::allocator<float>::~allocator
                ((allocator<float> *)
                 ((long)&blendImageAccess.super_ConstPixelBufferAccess.m_data + 3));
      TextureFormat::TextureFormat((TextureFormat *)&logImage_1.m_data.m_cap,RGBA,FLOAT);
      iVar6 = blendImage.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_;
      iVar5 = (int)blendImage.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      data = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_338,0);
      PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_368,(TextureFormat *)&logImage_1.m_data.m_cap,iVar6,
                 iVar5,1,data);
      TextureFormat::TextureFormat
                ((TextureFormat *)&logImageAccess_1.super_ConstPixelBufferAccess.m_data,RGBA,
                 UNORM_INT8);
      TextureLevel::TextureLevel
                ((TextureLevel *)local_398,
                 (TextureFormat *)&logImageAccess_1.super_ConstPixelBufferAccess.m_data,
                 blendImage.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_,
                 (int)blendImage.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,1);
      TextureLevel::getAccess
                ((PixelBufferAccess *)&sampler_1.seamlessCubeMap,(TextureLevel *)local_398);
      Vector<float,_4>::Vector(&local_414,0.0,0.0,0.0,0.0);
      Sampler::Sampler((Sampler *)local_404,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,NEAREST,
                       NEAREST,0.0,true,COMPAREMODE_NONE,0,&local_414,false,MODE_DEPTH);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&y_1);
      x_1 = iVar4;
      while (x_1 = x_1 + -1, -1 < x_1) {
        for (px = 0; px < iVar2; px = px + 1) {
          for (py = 0; py < iVar1; py = py + 1) {
            iVar5 = ~py + iVar1 + x_1;
            iVar6 = ~(py + px + x_1) + iVar1 + iVar4 + iVar2;
            ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)(s_1.m_data + 2),(int)local_368,iVar5,iVar6);
            ConstPixelBufferAccess::sample3D
                      ((ConstPixelBufferAccess *)(b.m_data + 2),(Sampler *)access,
                       (FilterMode)local_404,((float)py + 0.5) / (float)iVar1,
                       ((float)px + 0.5) / (float)iVar2,((float)x_1 + 0.5) / (float)iVar4);
            tcu::operator*((tcu *)&local_5f0,(Vector<float,_4> *)(s_1.m_data + 2),0.85);
            tcu::operator+((tcu *)local_5e0,(Vector<float,_4> *)(b.m_data + 2),&local_5f0);
            PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_368,(Vec4 *)local_5e0,iVar5,iVar6,0);
          }
        }
      }
      poVar11 = std::operator<<((ostream *)&y_1,description);
      poVar11 = std::operator<<(poVar11," (p\' = p * ");
      poVar11 = tcu::operator<<(poVar11,pixelScale);
      poVar11 = std::operator<<(poVar11," + ");
      poVar11 = tcu::operator<<(poVar11,pixelBias);
      std::operator<<(poVar11,")");
      Vector<int,_4>::Vector((Vector<int,_4> *)&y_2,0x33,0x66,0x99,0xff);
      tcu::clear((PixelBufferAccess *)&sampler_1.seamlessCubeMap,(IVec4 *)&y_2);
      for (x_2 = 0; x_2 < iVar4; x_2 = x_2 + 1) {
        for (px_1 = 0; px_1 < iVar2; px_1 = px_1 + 1) {
          for (py_1 = 0; py_1 < iVar1; py_1 = py_1 + 1) {
            if ((((x_2 == 0) || (py_1 == 0)) || (px_1 == iVar2 + -1)) || (px_1 == iVar2 + -2)) {
              s_2.m_data[3] = (float)(~py_1 + iVar1 + x_2);
              s_2.m_data[2] = (float)(~(py_1 + px_1 + x_2) + iVar1 + iVar4 + iVar2);
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_644,(int)local_368,(int)s_2.m_data[3],
                         (int)s_2.m_data[2]);
              tcu::operator*((tcu *)&local_634,(Vector<float,_4> *)local_644,pixelScale);
              tcu::operator+((tcu *)local_624,&local_634,pixelBias);
              PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)&sampler_1.seamlessCubeMap,(Vec4 *)local_624,
                         (int)s_2.m_data[3],(int)s_2.m_data[2],0);
            }
          }
        }
      }
      std::__cxx11::ostringstream::str();
      pcVar12 = (char *)std::__cxx11::string::c_str();
      iVar1 = ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&sampler_1.seamlessCubeMap)
      ;
      iVar2 = ConstPixelBufferAccess::getHeight
                        ((ConstPixelBufferAccess *)&sampler_1.seamlessCubeMap);
      iVar4 = ConstPixelBufferAccess::getRowPitch
                        ((ConstPixelBufferAccess *)&sampler_1.seamlessCubeMap);
      pvVar9 = PixelBufferAccess::getDataPtr((PixelBufferAccess *)&sampler_1.seamlessCubeMap);
      writeImage(this,name,pcVar12,compressionMode,QP_IMAGE_FORMAT_RGBA8888,iVar1,iVar2,iVar4,pvVar9
                );
      std::__cxx11::string::~string(local_668);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&y_1);
      TextureLevel::~TextureLevel((TextureLevel *)local_398);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_338);
    }
  }
  return;
}

Assistant:

void TestLog::writeImage (const char* name, const char* description, const ConstPixelBufferAccess& access, const Vec4& pixelScale, const Vec4& pixelBias, qpImageCompressionMode compressionMode)
{
	const TextureFormat&	format		= access.getFormat();
	int						width		= access.getWidth();
	int						height		= access.getHeight();
	int						depth		= access.getDepth();

	// Writing a combined image does not make sense
	DE_ASSERT(!tcu::isCombinedDepthStencilType(access.getFormat().type));

	// Do not bother with preprocessing if images are not stored
	if ((qpTestLog_getLogFlags(m_log) & QP_TEST_LOG_EXCLUDE_IMAGES) != 0)
		return;

	if (depth == 1 && format.type == TextureFormat::UNORM_INT8
		&& width <= MAX_IMAGE_SIZE_2D && height <= MAX_IMAGE_SIZE_2D
		&& (format.order == TextureFormat::RGB || format.order == TextureFormat::RGBA)
		&& access.getPixelPitch() == access.getFormat().getPixelSize()
		&& pixelBias[0] == 0.0f && pixelBias[1] == 0.0f && pixelBias[2] == 0.0f && pixelBias[3] == 0.0f
		&& pixelScale[0] == 1.0f && pixelScale[1] == 1.0f && pixelScale[2] == 1.0f && pixelScale[3] == 1.0f)
	{
		// Fast-path.
		bool isRGBA = format.order == TextureFormat::RGBA;

		writeImage(name, description, compressionMode,
				   isRGBA ? QP_IMAGE_FORMAT_RGBA8888 : QP_IMAGE_FORMAT_RGB888,
				   width, height, access.getRowPitch(), access.getDataPtr());
	}
	else if (depth == 1)
	{
		Sampler				sampler			(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::LINEAR, Sampler::NEAREST);
		IVec2				logImageSize	= computeScaledSize(IVec2(width, height), MAX_IMAGE_SIZE_2D);
		tcu::TextureLevel	logImage		(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), logImageSize.x(), logImageSize.y(), 1);
		PixelBufferAccess	logImageAccess	= logImage.getAccess();
		std::ostringstream	longDesc;

		longDesc << description << " (p' = p * " << pixelScale << " + " << pixelBias << ")";

		for (int y = 0; y < logImage.getHeight(); y++)
		{
			for (int x = 0; x < logImage.getWidth(); x++)
			{
				float	yf	= ((float)y + 0.5f) / (float)logImage.getHeight();
				float	xf	= ((float)x + 0.5f) / (float)logImage.getWidth();
				Vec4	s	= access.sample2D(sampler, sampler.minFilter, xf, yf, 0)*pixelScale + pixelBias;

				logImageAccess.setPixel(s, x, y);
			}
		}

		writeImage(name, longDesc.str().c_str(), compressionMode, QP_IMAGE_FORMAT_RGBA8888,
				   logImageAccess.getWidth(), logImageAccess.getHeight(), logImageAccess.getRowPitch(),
				   logImageAccess.getDataPtr());
	}
	else
	{
		// Isometric splat volume rendering.
		const float			blendFactor			= 0.85f;
		IVec3				scaledSize			= computeScaledSize(IVec3(width, height, depth), MAX_IMAGE_SIZE_3D);
		int					w					= scaledSize.x();
		int					h					= scaledSize.y();
		int					d					= scaledSize.z();
		int					logImageW			= w+d - 1;
		int					logImageH			= w+d+h;
		std::vector<float>	blendImage			(logImageW*logImageH*4, 0.0f);
		PixelBufferAccess	blendImageAccess	(TextureFormat(TextureFormat::RGBA, TextureFormat::FLOAT), logImageW, logImageH, 1, &blendImage[0]);
		tcu::TextureLevel	logImage			(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), logImageW, logImageH, 1);
		PixelBufferAccess	logImageAccess		= logImage.getAccess();
		Sampler				sampler				(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
		std::ostringstream	longDesc;

		// \note Back-to-front.
		for (int z = d-1; z >= 0; z--)
		{
			for (int y = 0; y < h; y++)
			{
				for (int x = 0; x < w; x++)
				{
					int		px	= w - (x + 1) + z;
					int		py	= (w + d + h) - (x + y + z + 1);

					float	xf	= ((float)x + 0.5f) / (float)w;
					float	yf	= ((float)y + 0.5f) / (float)h;
					float	zf	= ((float)z + 0.5f) / (float)d;

					Vec4	p	= blendImageAccess.getPixel(px, py);
					Vec4	s	= access.sample3D(sampler, sampler.minFilter, xf, yf, zf);
					Vec4	b	= s + p*blendFactor;

					blendImageAccess.setPixel(b, px, py);
				}
			}
		}

		// Scale blend image nicely.
		longDesc << description << " (p' = p * " << pixelScale << " + " << pixelBias << ")";

		// Write to final image.
		tcu::clear(logImageAccess, tcu::IVec4(0x33, 0x66, 0x99, 0xff));

		for (int z = 0; z < d; z++)
		{
			for (int y = 0; y < h; y++)
			{
				for (int x = 0; x < w; x++)
				{
					if (z != 0 && !(x == 0 || y == h-1 || y == h-2))
						continue;

					int		px	= w - (x + 1) + z;
					int		py	= (w + d + h) - (x + y + z + 1);
					Vec4	s	= blendImageAccess.getPixel(px, py)*pixelScale + pixelBias;

					logImageAccess.setPixel(s, px, py);
				}
			}
		}

		writeImage(name, longDesc.str().c_str(), compressionMode, QP_IMAGE_FORMAT_RGBA8888,
				   logImageAccess.getWidth(), logImageAccess.getHeight(), logImageAccess.getRowPitch(),
				   logImageAccess.getDataPtr());
	}
}